

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O3

bool __thiscall
ON_BinaryArchive::Write3dmReferencedComponentIndex
          (ON_BinaryArchive *this,ON_ModelComponent *model_component)

{
  ON_UUID model_id;
  bool bVar1;
  ON_UUID component_id;
  ON_UUID_struct local_28;
  
  if (this->m_bReferencedComponentIndexMapping == true) {
    local_28.Data1 = (model_component->m_component_id).Data1;
    local_28.Data2 = (model_component->m_component_id).Data2;
    local_28.Data3 = (model_component->m_component_id).Data3;
    local_28.Data4 = *&(model_component->m_component_id).Data4;
    bVar1 = ::operator==(&ON_nil_uuid,&local_28);
    if (bVar1) {
      bVar1 = Write3dmReferencedComponentIndex
                        (this,model_component->m_component_type,model_component->m_component_index);
    }
    else {
      model_id.Data4[0] = local_28.Data4[0];
      model_id.Data4[1] = local_28.Data4[1];
      model_id.Data4[2] = local_28.Data4[2];
      model_id.Data4[3] = local_28.Data4[3];
      model_id.Data4[4] = local_28.Data4[4];
      model_id.Data4[5] = local_28.Data4[5];
      model_id.Data4[6] = local_28.Data4[6];
      model_id.Data4[7] = local_28.Data4[7];
      model_id.Data1 = local_28.Data1;
      model_id.Data2 = local_28.Data2;
      model_id.Data3 = local_28.Data3;
      bVar1 = Write3dmReferencedComponentIndex(this,model_component->m_component_type,model_id);
    }
    return bVar1;
  }
  bVar1 = WriteInt(this,model_component->m_component_index);
  return bVar1;
}

Assistant:

bool ON_BinaryArchive::Write3dmReferencedComponentIndex(
  const ON_ModelComponent& model_component
  )
{
  if (ReferencedComponentIndexMapping())
  {
    // During writing, the m_manifest member stores 
    // the model id and index as the "Component" values and
    // the archive id and index as the "Manifest" values.
    const ON_UUID component_id = model_component.Id();
    return
      (ON_nil_uuid == component_id)
      ? Write3dmReferencedComponentIndex(model_component.ComponentType(), model_component.Index())
      : Write3dmReferencedComponentIndex(model_component.ComponentType(), component_id);
  }

  // no component mapping.
  return WriteInt(model_component.Index());
}